

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c
# Opt level: O3

char * parse_escape(dmr_C *C,char *p,uint *val,char *end,int bits,position pos)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  uint local_34;
  
  uVar2 = (uint)*p;
  if (uVar2 != 0x5c) {
    pcVar5 = p + 1;
    goto LAB_00107a6b;
  }
  pcVar6 = p + 2;
  bVar1 = p[1];
  uVar4 = (ulong)bVar1;
  uVar2 = (uint)(char)bVar1;
  pcVar5 = pcVar6;
  if (uVar4 < 0x40) {
    if ((0xff000000000000U >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x8000008400000000U >> (uVar4 & 0x3f) & 1) == 0) goto LAB_00107977;
    }
    else {
      pcVar5 = p + 4;
      if (end <= p + 4) {
        pcVar5 = end;
      }
      uVar2 = uVar2 - 0x30;
      for (; (pcVar6 < pcVar5 && ((int)*pcVar6 - 0x30U < 8)); pcVar6 = pcVar6 + 1) {
        uVar2 = ((int)*pcVar6 - 0x30U) + uVar2 * 8;
      }
      pcVar5 = pcVar6;
      if ((bits < 9) && ((uVar2 & 0x100) != 0)) {
        dmrC_warning(C,pos,"octal escape sequence out of range");
      }
    }
  }
  else {
LAB_00107977:
    switch(bVar1) {
    case 0x5c:
      break;
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 99:
    case 100:
switchD_0010796a_caseD_6f:
      dmrC_warning(C,pos,"unknown escape sequence: \'\\%c\'",(ulong)uVar2);
      break;
    case 0x61:
      uVar2 = 7;
      break;
    case 0x62:
      uVar2 = 8;
      break;
    case 0x65:
      uVar2 = 0x1b;
      break;
    case 0x66:
      uVar2 = 0xc;
      break;
    default:
      switch(bVar1) {
      case 0x6e:
        uVar2 = 10;
        break;
      default:
        goto switchD_0010796a_caseD_6f;
      case 0x72:
        uVar2 = 0xd;
        break;
      case 0x74:
        uVar2 = 9;
        break;
      case 0x76:
        uVar2 = 0xb;
        break;
      case 0x78:
        uVar2 = 0;
        if (pcVar6 < end) {
          local_34 = -1 << ((char)bits - 4U & 0x1f);
          uVar2 = 0;
          do {
            uVar3 = dmrC_hexval((int)*pcVar6);
            pcVar5 = pcVar6;
            if (0x10 < uVar3) break;
            if ((local_34 & uVar2) != 0) {
              local_34 = 0;
              dmrC_warning(C,pos,"hex escape sequence out of range");
            }
            pcVar6 = pcVar6 + 1;
            uVar2 = uVar3 + uVar2 * 0x10;
            pcVar5 = end;
          } while (pcVar6 != end);
        }
      }
    }
  }
  uVar2 = ~(-2 << ((char)bits - 1U & 0x1f)) & uVar2;
LAB_00107a6b:
  *val = uVar2;
  return pcVar5;
}

Assistant:

static const char *parse_escape(struct dmr_C *C, const char *p, unsigned *val, const char *end, int bits, struct position pos)
{
	unsigned c = *p++;
	unsigned d;
	if (c != '\\') {
		*val = c;
		return p;
	}

	c = *p++;
	switch (c) {
	case 'a': c = '\a'; break;
	case 'b': c = '\b'; break;
	case 't': c = '\t'; break;
	case 'n': c = '\n'; break;
	case 'v': c = '\v'; break;
	case 'f': c = '\f'; break;
	case 'r': c = '\r'; break;
#ifndef _MSC_VER
	case 'e': c = '\e'; break;
#endif
	case 'x': {
		unsigned mask = -(1U << (bits - 4));
		for (c = 0; p < end; c = (c << 4) + d) {
			d = dmrC_hexval(*p);
			if (d > 16)
				break;
			p++;
			if (c & mask) {
				dmrC_warning(C, pos,
					"hex escape sequence out of range");
				mask = 0;
			}
		}
		break;
	}
	case '0':case '1': case '2': case '3': case '4': case '5':
	case '6': case '7': {
		if (p + 2 < end)
			end = p + 2;
		c -= '0';
		while (p < end && (d = *p - '0') < 8) {
			c = (c << 3) + d;
			p++;
		}
		if ((c & 0400) && bits < 9)
			dmrC_warning(C, pos,
				"octal escape sequence out of range");
		break;
	}
	default:	/* everything else is left as is */
		dmrC_warning(C, pos, "unknown escape sequence: '\\%c'", c);
		break;
	case '\\':
	case '\'':
	case '"':
	case '?':
		break;	/* those are legal, so no warnings */
	}
	*val = c & ~((~0U << (bits - 1)) << 1);
	return p;
}